

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

TestInfo * __thiscall testing::TestCase::GetTestInfo(TestCase *this,int i)

{
  int iVar1;
  const_reference ppTVar2;
  long in_RDI;
  int index;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  value_type pTVar3;
  
  iVar1 = internal::GetElementOr<int>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  if (iVar1 < 0) {
    pTVar3 = (value_type)0x0;
  }
  else {
    ppTVar2 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                        ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                         (in_RDI + 0x30),(long)iVar1);
    pTVar3 = *ppTVar2;
  }
  return pTVar3;
}

Assistant:

const TestInfo* TestCase::GetTestInfo(int i) const {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? NULL : test_info_list_[index];
}